

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 (*pauVar21) [16];
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined4 uVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1314;
  ulong local_1310;
  ulong local_1308;
  Geometry *local_1300;
  long local_12f8;
  Scene *local_12f0;
  long local_12e8;
  RTCFilterFunctionNArguments local_12e0;
  float local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined4 local_129c;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  undefined1 auVar40 [16];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    pauVar33 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar38._8_4_ = 0x7fffffff;
    auVar38._0_8_ = 0x7fffffff7fffffff;
    auVar38._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl((undefined1  [16])aVar4,auVar38);
    auVar39._8_4_ = 0x219392ef;
    auVar39._0_8_ = 0x219392ef219392ef;
    auVar39._12_4_ = 0x219392ef;
    uVar30 = vcmpps_avx512vl(auVar38,auVar39,1);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar38 = vdivps_avx(auVar94,(undefined1  [16])aVar4);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar6 = (bool)((byte)uVar30 & 1);
    auVar40._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar38._0_4_;
    bVar6 = (bool)((byte)(uVar30 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar38._4_4_;
    bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar38._8_4_;
    bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar38._12_4_;
    auVar41._8_4_ = 0x3f7ffffa;
    auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar41._12_4_ = 0x3f7ffffa;
    auVar41 = vmulps_avx512vl(auVar40,auVar41);
    auVar42._8_4_ = 0x3f800003;
    auVar42._0_8_ = 0x3f8000033f800003;
    auVar42._12_4_ = 0x3f800003;
    auVar42 = vmulps_avx512vl(auVar40,auVar42);
    local_1230 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar107 = ZEXT1664(local_1230);
    local_1240 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar108 = ZEXT1664(local_1240);
    local_1250 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar109 = ZEXT1664(local_1250);
    local_1260 = vbroadcastss_avx512vl(auVar41);
    auVar110 = ZEXT1664(local_1260);
    auVar38 = vmovshdup_avx(auVar41);
    local_1270 = vshufps_avx512vl(auVar41,auVar41,0x55);
    auVar111 = ZEXT1664(local_1270);
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    local_1280 = vshufps_avx512vl(auVar41,auVar41,0xaa);
    auVar112 = ZEXT1664(local_1280);
    fVar83 = auVar42._0_4_;
    local_1200 = vshufps_avx(auVar42,auVar42,0x55);
    auVar104 = ZEXT1664(local_1200);
    local_1210 = vshufps_avx(auVar42,auVar42,0xaa);
    auVar105 = ZEXT1664(local_1210);
    uVar30 = (ulong)(auVar41._0_4_ < 0.0) << 4;
    uVar31 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
    uVar29 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x40;
    uVar32 = uVar30 ^ 0x10;
    uVar35 = uVar31 ^ 0x10;
    uVar87 = auVar43._0_4_;
    local_1220._4_4_ = uVar87;
    local_1220._0_4_ = uVar87;
    local_1220._8_4_ = uVar87;
    local_1220._12_4_ = uVar87;
    auVar106 = ZEXT1664(local_1220);
    uVar87 = auVar44._0_4_;
    auVar86 = ZEXT1664(CONCAT412(uVar87,CONCAT48(uVar87,CONCAT44(uVar87,uVar87))));
    local_1308 = uVar30;
    local_1310 = uVar31;
    local_11f0 = fVar83;
    fStack_11ec = fVar83;
    fStack_11e8 = fVar83;
    fStack_11e4 = fVar83;
    fVar100 = fVar83;
    fVar101 = fVar83;
    fVar102 = fVar83;
LAB_01be0a05:
    if (pauVar33 != (undefined1 (*) [16])&local_fa0) {
      pauVar21 = pauVar33 + -1;
      pauVar33 = pauVar33 + -1;
      if (*(float *)((long)*pauVar21 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar36 = *(ulong *)*pauVar33;
        while ((uVar36 & 8) == 0) {
          auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar30),auVar107._0_16_);
          auVar38 = vmulps_avx512vl(auVar110._0_16_,auVar38);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar31),auVar108._0_16_);
          auVar43 = vmulps_avx512vl(auVar111._0_16_,auVar43);
          auVar38 = vmaxps_avx(auVar38,auVar43);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar29),auVar109._0_16_);
          auVar43 = vmulps_avx512vl(auVar112._0_16_,auVar43);
          auVar43 = vmaxps_avx(auVar43,auVar106._0_16_);
          auVar38 = vmaxps_avx(auVar38,auVar43);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar32),auVar107._0_16_);
          auVar44._0_4_ = fVar83 * auVar43._0_4_;
          auVar44._4_4_ = fVar100 * auVar43._4_4_;
          auVar44._8_4_ = fVar101 * auVar43._8_4_;
          auVar44._12_4_ = fVar102 * auVar43._12_4_;
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar35),auVar108._0_16_);
          auVar90._0_4_ = auVar104._0_4_ * auVar43._0_4_;
          auVar90._4_4_ = auVar104._4_4_ * auVar43._4_4_;
          auVar90._8_4_ = auVar104._8_4_ * auVar43._8_4_;
          auVar90._12_4_ = auVar104._12_4_ * auVar43._12_4_;
          auVar43 = vminps_avx(auVar44,auVar90);
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar29 ^ 0x10)),
                                    auVar109._0_16_);
          auVar91._0_4_ = auVar105._0_4_ * auVar44._0_4_;
          auVar91._4_4_ = auVar105._4_4_ * auVar44._4_4_;
          auVar91._8_4_ = auVar105._8_4_ * auVar44._8_4_;
          auVar91._12_4_ = auVar105._12_4_ * auVar44._12_4_;
          auVar44 = vminps_avx(auVar91,auVar86._0_16_);
          auVar43 = vminps_avx(auVar43,auVar44);
          uVar37 = vcmpps_avx512vl(auVar38,auVar43,2);
          local_1180._0_16_ = auVar38;
          if ((char)uVar37 == '\0') goto LAB_01be0a05;
          uVar34 = uVar36 & 0xfffffffffffffff0;
          lVar15 = 0;
          for (uVar36 = uVar37; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar36 = *(ulong *)(uVar34 + lVar15 * 8);
          uVar24 = (uint)uVar37 - 1 & (uint)uVar37;
          uVar37 = (ulong)uVar24;
          if (uVar24 != 0) {
            uVar25 = *(uint *)(local_1180 + lVar15 * 4);
            lVar15 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar26 = (ulong)uVar24;
            uVar37 = *(ulong *)(uVar34 + lVar15 * 8);
            uVar28 = *(uint *)(local_1180 + lVar15 * 4);
            if (uVar24 == 0) {
              if (uVar25 < uVar28) {
                *(ulong *)*pauVar33 = uVar37;
                *(uint *)((long)*pauVar33 + 8) = uVar28;
                pauVar33 = pauVar33 + 1;
              }
              else {
                *(ulong *)*pauVar33 = uVar36;
                *(uint *)((long)*pauVar33 + 8) = uVar25;
                pauVar33 = pauVar33 + 1;
                uVar36 = uVar37;
              }
            }
            else {
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uVar36;
              auVar38 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar25));
              auVar88._8_8_ = 0;
              auVar88._0_8_ = uVar37;
              auVar43 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar28));
              lVar15 = 0;
              for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar24 = uVar24 - 1 & uVar24;
              uVar36 = (ulong)uVar24;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(uVar34 + lVar15 * 8);
              auVar42 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1180 + lVar15 * 4)));
              auVar44 = vpshufd_avx(auVar38,0xaa);
              auVar39 = vpshufd_avx(auVar43,0xaa);
              auVar41 = vpshufd_avx(auVar42,0xaa);
              if (uVar24 == 0) {
                uVar36 = vpcmpgtd_avx512vl(auVar39,auVar44);
                uVar36 = uVar36 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar43,auVar38);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar45._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar44._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar45._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                auVar43 = vmovdqa32_avx512vl(auVar43);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar46._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar46._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar38 = vpshufd_avx(auVar45,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar41,auVar38);
                uVar37 = uVar37 & 0xf;
                auVar43 = vpblendmd_avx512vl(auVar42,auVar45);
                bVar6 = (bool)((byte)uVar37 & 1);
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                uVar36 = CONCAT44((uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar38._4_4_,
                                  (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar38._0_4_);
                auVar38 = vmovdqa32_avx512vl(auVar42);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar47._0_4_ = (uint)bVar6 * auVar38._0_4_ | !bVar6 * auVar45._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar6 * auVar38._4_4_ | !bVar6 * auVar45._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar6 * auVar38._8_4_ | !bVar6 * auVar45._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar47._12_4_ = (uint)bVar6 * auVar38._12_4_ | !bVar6 * auVar45._12_4_;
                auVar38 = vpshufd_avx(auVar47,0xaa);
                auVar43 = vpshufd_avx(auVar46,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar38,auVar43);
                uVar37 = uVar37 & 0xf;
                auVar43 = vpblendmd_avx512vl(auVar47,auVar46);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar48._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar48._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar38 = vmovdqa32_avx512vl(auVar47);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar49._0_4_ = (uint)bVar6 * auVar38._0_4_ | !bVar6 * auVar46._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar6 * auVar38._4_4_ | !bVar6 * auVar46._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar6 * auVar38._8_4_ | !bVar6 * auVar46._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar49._12_4_ = (uint)bVar6 * auVar38._12_4_ | !bVar6 * auVar46._12_4_;
                *pauVar33 = auVar49;
                pauVar33[1] = auVar48;
                pauVar33 = pauVar33 + 2;
              }
              else {
                lVar15 = 0;
                for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                  lVar15 = lVar15 + 1;
                }
                uVar24 = *(uint *)(local_1180 + lVar15 * 4);
                auVar97._8_8_ = 0;
                auVar97._0_8_ = *(ulong *)(uVar34 + lVar15 * 8);
                auVar40 = vpunpcklqdq_avx(auVar97,ZEXT416(uVar24));
                uVar36 = vpcmpgtd_avx512vl(auVar39,auVar44);
                uVar36 = uVar36 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar43,auVar38);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar50._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar44._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar50._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar50._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar50._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                auVar43 = vmovdqa32_avx512vl(auVar43);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar51._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar51._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar51._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar51._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar92._4_4_ = uVar24;
                auVar92._0_4_ = uVar24;
                auVar92._8_4_ = uVar24;
                auVar92._12_4_ = uVar24;
                uVar36 = vpcmpgtd_avx512vl(auVar92,auVar41);
                uVar36 = uVar36 & 0xf;
                auVar38 = vpblendmd_avx512vl(auVar40,auVar42);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar52._0_4_ = (uint)bVar6 * auVar38._0_4_ | !bVar6 * uVar24;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar52._4_4_ = (uint)bVar6 * auVar38._4_4_ | !bVar6 * uVar24;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar52._8_4_ = (uint)bVar6 * auVar38._8_4_ | !bVar6 * uVar24;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar52._12_4_ = (uint)bVar6 * auVar38._12_4_ | !bVar6 * uVar24;
                auVar38 = vmovdqa32_avx512vl(auVar40);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar53._0_4_ = (uint)bVar6 * auVar38._0_4_ | (uint)!bVar6 * auVar42._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar53._4_4_ = (uint)bVar6 * auVar38._4_4_ | (uint)!bVar6 * auVar42._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar53._8_4_ = (uint)bVar6 * auVar38._8_4_ | (uint)!bVar6 * auVar42._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar53._12_4_ = (uint)bVar6 * auVar38._12_4_ | (uint)!bVar6 * auVar42._12_4_;
                auVar38 = vpshufd_avx(auVar53,0xaa);
                auVar43 = vpshufd_avx(auVar51,0xaa);
                uVar36 = vpcmpgtd_avx512vl(auVar38,auVar43);
                uVar36 = uVar36 & 0xf;
                auVar43 = vpblendmd_avx512vl(auVar53,auVar51);
                bVar6 = (bool)((byte)uVar36 & 1);
                auVar54._0_4_ = (uint)bVar6 * auVar43._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar54._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar54._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar36 >> 3,0);
                auVar54._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar44 = vmovdqa32_avx512vl(auVar53);
                bVar6 = (bool)((byte)uVar36 & 1);
                bVar8 = (bool)((byte)(uVar36 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
                bVar11 = SUB81(uVar36 >> 3,0);
                auVar38 = vpshufd_avx(auVar52,0xaa);
                auVar43 = vpshufd_avx(auVar50,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar38,auVar43);
                uVar37 = uVar37 & 0xf;
                auVar43 = vpblendmd_avx512vl(auVar52,auVar50);
                bVar7 = (bool)((byte)uVar37 & 1);
                bVar9 = (bool)((byte)(uVar37 >> 1) & 1);
                uVar36 = CONCAT44((uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar38._4_4_,
                                  (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar38._0_4_);
                auVar38 = vmovdqa32_avx512vl(auVar52);
                bVar7 = (bool)((byte)uVar37 & 1);
                auVar55._0_4_ = (uint)bVar7 * auVar38._0_4_ | !bVar7 * auVar50._0_4_;
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar7 * auVar38._4_4_ | !bVar7 * auVar50._4_4_;
                bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar7 * auVar38._8_4_ | !bVar7 * auVar50._8_4_;
                bVar7 = SUB81(uVar37 >> 3,0);
                auVar55._12_4_ = (uint)bVar7 * auVar38._12_4_ | !bVar7 * auVar50._12_4_;
                auVar38 = vpshufd_avx(auVar55,0xaa);
                auVar43 = vpshufd_avx(auVar54,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar43,auVar38);
                uVar37 = uVar37 & 0xf;
                auVar43 = vpblendmd_avx512vl(auVar54,auVar55);
                bVar7 = (bool)((byte)uVar37 & 1);
                auVar56._0_4_ = (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar38._0_4_;
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar38._4_4_;
                bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar38._8_4_;
                bVar7 = SUB81(uVar37 >> 3,0);
                auVar56._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar38._12_4_;
                auVar38 = vmovdqa32_avx512vl(auVar54);
                bVar7 = (bool)((byte)uVar37 & 1);
                auVar57._0_4_ = (uint)bVar7 * auVar38._0_4_ | !bVar7 * auVar55._0_4_;
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar7 * auVar38._4_4_ | !bVar7 * auVar55._4_4_;
                bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar7 * auVar38._8_4_ | !bVar7 * auVar55._8_4_;
                bVar7 = SUB81(uVar37 >> 3,0);
                auVar57._12_4_ = (uint)bVar7 * auVar38._12_4_ | !bVar7 * auVar55._12_4_;
                *(uint *)*pauVar33 = (uint)bVar6 * auVar44._0_4_ | !bVar6 * auVar51._0_4_;
                *(uint *)((long)*pauVar33 + 4) =
                     (uint)bVar8 * auVar44._4_4_ | !bVar8 * auVar51._4_4_;
                *(uint *)((long)*pauVar33 + 8) =
                     (uint)bVar10 * auVar44._8_4_ | !bVar10 * auVar51._8_4_;
                *(uint *)((long)*pauVar33 + 0xc) =
                     (uint)bVar11 * auVar44._12_4_ | !bVar11 * auVar51._12_4_;
                pauVar33[1] = auVar57;
                pauVar33[2] = auVar56;
                pauVar33 = pauVar33 + 3;
              }
            }
          }
        }
        local_12f8 = (ulong)((uint)uVar36 & 0xf) - 8;
        uVar36 = uVar36 & 0xfffffffffffffff0;
        for (local_12e8 = 0; local_12e8 != local_12f8; local_12e8 = local_12e8 + 1) {
          lVar23 = local_12e8 * 0xe0;
          lVar15 = uVar36 + 0xd0 + lVar23;
          local_11a0 = *(undefined8 *)(lVar15 + 0x10);
          uStack_1198 = *(undefined8 *)(lVar15 + 0x18);
          lVar15 = uVar36 + 0xc0 + lVar23;
          local_fc0 = *(undefined8 *)(lVar15 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar15 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          uStack_1190 = local_11a0;
          uStack_1188 = uStack_1198;
          auVar80._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x60 + lVar23);
          auVar80._0_16_ = *(undefined1 (*) [16])(uVar36 + lVar23);
          auVar60._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x70 + lVar23);
          auVar60._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x10 + lVar23);
          auVar61._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x80 + lVar23);
          auVar61._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x20 + lVar23);
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0x30 + lVar23);
          auVar66._16_16_ = auVar38;
          auVar66._0_16_ = auVar38;
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0x40 + lVar23);
          auVar67._16_16_ = auVar38;
          auVar67._0_16_ = auVar38;
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0x50 + lVar23);
          auVar68._16_16_ = auVar38;
          auVar68._0_16_ = auVar38;
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0x90 + lVar23);
          auVar69._16_16_ = auVar38;
          auVar69._0_16_ = auVar38;
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0xa0 + lVar23);
          auVar70._16_16_ = auVar38;
          auVar70._0_16_ = auVar38;
          auVar38 = *(undefined1 (*) [16])(uVar36 + 0xb0 + lVar23);
          auVar71._16_16_ = auVar38;
          auVar71._0_16_ = auVar38;
          uVar87 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar72._4_4_ = uVar87;
          auVar72._0_4_ = uVar87;
          auVar72._8_4_ = uVar87;
          auVar72._12_4_ = uVar87;
          auVar72._16_4_ = uVar87;
          auVar72._20_4_ = uVar87;
          auVar72._24_4_ = uVar87;
          auVar72._28_4_ = uVar87;
          auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
          auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
          uVar87 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar95._4_4_ = uVar87;
          auVar95._0_4_ = uVar87;
          auVar95._8_4_ = uVar87;
          auVar95._12_4_ = uVar87;
          auVar95._16_4_ = uVar87;
          auVar95._20_4_ = uVar87;
          auVar95._24_4_ = uVar87;
          auVar95._28_4_ = uVar87;
          uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar98._4_4_ = uVar87;
          auVar98._0_4_ = uVar87;
          auVar98._8_4_ = uVar87;
          auVar98._12_4_ = uVar87;
          auVar98._16_4_ = uVar87;
          auVar98._20_4_ = uVar87;
          auVar98._24_4_ = uVar87;
          auVar98._28_4_ = uVar87;
          fVar100 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar103._4_4_ = fVar100;
          auVar103._0_4_ = fVar100;
          auVar103._8_4_ = fVar100;
          auVar103._12_4_ = fVar100;
          auVar103._16_4_ = fVar100;
          auVar103._20_4_ = fVar100;
          auVar103._24_4_ = fVar100;
          auVar103._28_4_ = fVar100;
          auVar80 = vsubps_avx(auVar80,auVar72);
          auVar60 = vsubps_avx512vl(auVar60,auVar58);
          auVar61 = vsubps_avx512vl(auVar61,auVar59);
          auVar62 = vsubps_avx512vl(auVar66,auVar72);
          auVar63 = vsubps_avx512vl(auVar67,auVar58);
          auVar64 = vsubps_avx512vl(auVar68,auVar59);
          auVar79 = vsubps_avx(auVar69,auVar72);
          auVar65 = vsubps_avx512vl(auVar70,auVar58);
          auVar66 = vsubps_avx512vl(auVar71,auVar59);
          auVar58 = vsubps_avx(auVar79,auVar80);
          auVar67 = vsubps_avx512vl(auVar65,auVar60);
          auVar59 = vsubps_avx(auVar66,auVar61);
          auVar68 = vsubps_avx512vl(auVar80,auVar62);
          auVar69 = vsubps_avx512vl(auVar60,auVar63);
          auVar70 = vsubps_avx512vl(auVar61,auVar64);
          auVar71 = vsubps_avx512vl(auVar62,auVar79);
          auVar72 = vsubps_avx512vl(auVar63,auVar65);
          auVar73 = vsubps_avx512vl(auVar64,auVar66);
          auVar78._0_4_ = auVar79._0_4_ + auVar80._0_4_;
          auVar78._4_4_ = auVar79._4_4_ + auVar80._4_4_;
          auVar78._8_4_ = auVar79._8_4_ + auVar80._8_4_;
          auVar78._12_4_ = auVar79._12_4_ + auVar80._12_4_;
          auVar78._16_4_ = auVar79._16_4_ + auVar80._16_4_;
          auVar78._20_4_ = auVar79._20_4_ + auVar80._20_4_;
          auVar78._24_4_ = auVar79._24_4_ + auVar80._24_4_;
          auVar78._28_4_ = auVar79._28_4_ + auVar80._28_4_;
          auVar74 = vaddps_avx512vl(auVar65,auVar60);
          auVar75 = vaddps_avx512vl(auVar66,auVar61);
          auVar76 = vmulps_avx512vl(auVar74,auVar59);
          auVar76 = vfmsub231ps_avx512vl(auVar76,auVar67,auVar75);
          auVar75 = vmulps_avx512vl(auVar75,auVar58);
          auVar77 = vfmsub231ps_avx512vl(auVar75,auVar59,auVar78);
          auVar75._4_4_ = auVar67._4_4_ * auVar78._4_4_;
          auVar75._0_4_ = auVar67._0_4_ * auVar78._0_4_;
          auVar75._8_4_ = auVar67._8_4_ * auVar78._8_4_;
          auVar75._12_4_ = auVar67._12_4_ * auVar78._12_4_;
          auVar75._16_4_ = auVar67._16_4_ * auVar78._16_4_;
          auVar75._20_4_ = auVar67._20_4_ * auVar78._20_4_;
          auVar75._24_4_ = auVar67._24_4_ * auVar78._24_4_;
          auVar75._28_4_ = auVar78._28_4_;
          auVar38 = vfmsub231ps_fma(auVar75,auVar58,auVar74);
          auVar93._0_4_ = fVar100 * auVar38._0_4_;
          auVar93._4_4_ = fVar100 * auVar38._4_4_;
          auVar93._8_4_ = fVar100 * auVar38._8_4_;
          auVar93._12_4_ = fVar100 * auVar38._12_4_;
          auVar93._16_4_ = fVar100 * 0.0;
          auVar93._20_4_ = fVar100 * 0.0;
          auVar93._24_4_ = fVar100 * 0.0;
          auVar93._28_4_ = 0;
          auVar75 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar77);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar95,auVar76);
          auVar74 = vaddps_avx512vl(auVar80,auVar62);
          auVar76 = vaddps_avx512vl(auVar60,auVar63);
          auVar77 = vaddps_avx512vl(auVar61,auVar64);
          auVar78 = vmulps_avx512vl(auVar76,auVar70);
          auVar78 = vfmsub231ps_avx512vl(auVar78,auVar69,auVar77);
          auVar77 = vmulps_avx512vl(auVar77,auVar68);
          auVar77 = vfmsub231ps_avx512vl(auVar77,auVar70,auVar74);
          auVar74 = vmulps_avx512vl(auVar74,auVar69);
          auVar76 = vfmsub231ps_avx512vl(auVar74,auVar68,auVar76);
          auVar74._4_4_ = fVar100 * auVar76._4_4_;
          auVar74._0_4_ = fVar100 * auVar76._0_4_;
          auVar74._8_4_ = fVar100 * auVar76._8_4_;
          auVar74._12_4_ = fVar100 * auVar76._12_4_;
          auVar74._16_4_ = fVar100 * auVar76._16_4_;
          auVar74._20_4_ = fVar100 * auVar76._20_4_;
          auVar74._24_4_ = fVar100 * auVar76._24_4_;
          auVar74._28_4_ = auVar76._28_4_;
          auVar74 = vfmadd231ps_avx512vl(auVar74,auVar98,auVar77);
          local_1160 = vfmadd231ps_avx512vl(auVar74,auVar95,auVar78);
          auVar79 = vaddps_avx512vl(auVar62,auVar79);
          auVar62 = vaddps_avx512vl(auVar63,auVar65);
          auVar63 = vaddps_avx512vl(auVar64,auVar66);
          auVar74 = vmulps_avx512vl(auVar62,auVar73);
          auVar74 = vfmsub231ps_avx512vl(auVar74,auVar72,auVar63);
          auVar64._4_4_ = auVar63._4_4_ * auVar71._4_4_;
          auVar64._0_4_ = auVar63._0_4_ * auVar71._0_4_;
          auVar64._8_4_ = auVar63._8_4_ * auVar71._8_4_;
          auVar64._12_4_ = auVar63._12_4_ * auVar71._12_4_;
          auVar64._16_4_ = auVar63._16_4_ * auVar71._16_4_;
          auVar64._20_4_ = auVar63._20_4_ * auVar71._20_4_;
          auVar64._24_4_ = auVar63._24_4_ * auVar71._24_4_;
          auVar64._28_4_ = auVar63._28_4_;
          auVar38 = vfmsub231ps_fma(auVar64,auVar73,auVar79);
          auVar65._4_4_ = auVar79._4_4_ * auVar72._4_4_;
          auVar65._0_4_ = auVar79._0_4_ * auVar72._0_4_;
          auVar65._8_4_ = auVar79._8_4_ * auVar72._8_4_;
          auVar65._12_4_ = auVar79._12_4_ * auVar72._12_4_;
          auVar65._16_4_ = auVar79._16_4_ * auVar72._16_4_;
          auVar65._20_4_ = auVar79._20_4_ * auVar72._20_4_;
          auVar65._24_4_ = auVar79._24_4_ * auVar72._24_4_;
          auVar65._28_4_ = auVar79._28_4_;
          auVar79 = vfmsub231ps_avx512vl(auVar65,auVar71,auVar62);
          auVar79 = vmulps_avx512vl(auVar103,auVar79);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar98,ZEXT1632(auVar38));
          auVar74 = vfmadd231ps_avx512vl(auVar79,auVar95,auVar74);
          auVar76._0_4_ = auVar75._0_4_ + local_1160._0_4_;
          auVar76._4_4_ = auVar75._4_4_ + local_1160._4_4_;
          auVar76._8_4_ = auVar75._8_4_ + local_1160._8_4_;
          auVar76._12_4_ = auVar75._12_4_ + local_1160._12_4_;
          auVar76._16_4_ = auVar75._16_4_ + local_1160._16_4_;
          auVar76._20_4_ = auVar75._20_4_ + local_1160._20_4_;
          auVar76._24_4_ = auVar75._24_4_ + local_1160._24_4_;
          auVar76._28_4_ = auVar75._28_4_ + local_1160._28_4_;
          local_1140 = vaddps_avx512vl(auVar74,auVar76);
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          auVar79._16_4_ = 0x7fffffff;
          auVar79._20_4_ = 0x7fffffff;
          auVar79._24_4_ = 0x7fffffff;
          auVar79._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_1140,auVar79);
          auVar62._8_4_ = 0x34000000;
          auVar62._0_8_ = 0x3400000034000000;
          auVar62._12_4_ = 0x34000000;
          auVar62._16_4_ = 0x34000000;
          auVar62._20_4_ = 0x34000000;
          auVar62._24_4_ = 0x34000000;
          auVar62._28_4_ = 0x34000000;
          auVar79 = vmulps_avx512vl(local_1140,auVar62);
          auVar62 = vminps_avx512vl(auVar75,local_1160);
          auVar62 = vminps_avx512vl(auVar62,auVar74);
          auVar63._8_4_ = 0x80000000;
          auVar63._0_8_ = 0x8000000080000000;
          auVar63._12_4_ = 0x80000000;
          auVar63._16_4_ = 0x80000000;
          auVar63._20_4_ = 0x80000000;
          auVar63._24_4_ = 0x80000000;
          auVar63._28_4_ = 0x80000000;
          auVar63 = vxorps_avx512vl(auVar79,auVar63);
          uVar12 = vcmpps_avx512vl(auVar62,auVar63,5);
          auVar62 = vmaxps_avx512vl(auVar75,local_1160);
          auVar62 = vmaxps_avx512vl(auVar62,auVar74);
          uVar13 = vcmpps_avx512vl(auVar62,auVar79,2);
          local_10c0 = (byte)uVar12 | (byte)uVar13;
          if (local_10c0 != 0) {
            auVar79 = vmulps_avx512vl(auVar59,auVar69);
            auVar62 = vmulps_avx512vl(auVar58,auVar70);
            auVar63 = vmulps_avx512vl(auVar67,auVar68);
            auVar74 = vmulps_avx512vl(auVar70,auVar72);
            auVar64 = vmulps_avx512vl(auVar68,auVar73);
            auVar65 = vmulps_avx512vl(auVar69,auVar71);
            auVar66 = vfmsub213ps_avx512vl(auVar67,auVar70,auVar79);
            auVar59 = vfmsub213ps_avx512vl(auVar59,auVar68,auVar62);
            auVar58 = vfmsub213ps_avx512vl(auVar58,auVar69,auVar63);
            auVar67 = vfmsub213ps_avx512vl(auVar73,auVar69,auVar74);
            auVar69 = vfmsub213ps_avx512vl(auVar71,auVar70,auVar64);
            auVar68 = vfmsub213ps_avx512vl(auVar72,auVar68,auVar65);
            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar79,auVar70);
            vandps_avx512vl(auVar74,auVar70);
            uVar37 = vcmpps_avx512vl(auVar70,auVar70,1);
            vandps_avx512vl(auVar62,auVar70);
            vandps_avx512vl(auVar64,auVar70);
            uVar34 = vcmpps_avx512vl(auVar70,auVar70,1);
            vandps_avx512vl(auVar63,auVar70);
            vandps_avx512vl(auVar65,auVar70);
            uVar26 = vcmpps_avx512vl(auVar70,auVar70,1);
            bVar6 = (bool)((byte)uVar37 & 1);
            local_1120._0_4_ = (float)((uint)bVar6 * auVar66._0_4_ | (uint)!bVar6 * auVar67._0_4_);
            bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
            local_1120._4_4_ = (float)((uint)bVar6 * auVar66._4_4_ | (uint)!bVar6 * auVar67._4_4_);
            bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
            local_1120._8_4_ = (float)((uint)bVar6 * auVar66._8_4_ | (uint)!bVar6 * auVar67._8_4_);
            bVar6 = (bool)((byte)(uVar37 >> 3) & 1);
            local_1120._12_4_ =
                 (float)((uint)bVar6 * auVar66._12_4_ | (uint)!bVar6 * auVar67._12_4_);
            bVar6 = (bool)((byte)(uVar37 >> 4) & 1);
            local_1120._16_4_ =
                 (float)((uint)bVar6 * auVar66._16_4_ | (uint)!bVar6 * auVar67._16_4_);
            bVar6 = (bool)((byte)(uVar37 >> 5) & 1);
            local_1120._20_4_ =
                 (float)((uint)bVar6 * auVar66._20_4_ | (uint)!bVar6 * auVar67._20_4_);
            bVar6 = (bool)((byte)(uVar37 >> 6) & 1);
            local_1120._24_4_ =
                 (float)((uint)bVar6 * auVar66._24_4_ | (uint)!bVar6 * auVar67._24_4_);
            bVar6 = SUB81(uVar37 >> 7,0);
            local_1120._28_4_ = (uint)bVar6 * auVar66._28_4_ | (uint)!bVar6 * auVar67._28_4_;
            bVar6 = (bool)((byte)uVar34 & 1);
            local_1100._0_4_ = (float)((uint)bVar6 * auVar59._0_4_ | (uint)!bVar6 * auVar69._0_4_);
            bVar6 = (bool)((byte)(uVar34 >> 1) & 1);
            local_1100._4_4_ = (float)((uint)bVar6 * auVar59._4_4_ | (uint)!bVar6 * auVar69._4_4_);
            bVar6 = (bool)((byte)(uVar34 >> 2) & 1);
            local_1100._8_4_ = (float)((uint)bVar6 * auVar59._8_4_ | (uint)!bVar6 * auVar69._8_4_);
            bVar6 = (bool)((byte)(uVar34 >> 3) & 1);
            local_1100._12_4_ =
                 (float)((uint)bVar6 * auVar59._12_4_ | (uint)!bVar6 * auVar69._12_4_);
            bVar6 = (bool)((byte)(uVar34 >> 4) & 1);
            local_1100._16_4_ =
                 (float)((uint)bVar6 * auVar59._16_4_ | (uint)!bVar6 * auVar69._16_4_);
            bVar6 = (bool)((byte)(uVar34 >> 5) & 1);
            local_1100._20_4_ =
                 (float)((uint)bVar6 * auVar59._20_4_ | (uint)!bVar6 * auVar69._20_4_);
            bVar6 = (bool)((byte)(uVar34 >> 6) & 1);
            local_1100._24_4_ =
                 (float)((uint)bVar6 * auVar59._24_4_ | (uint)!bVar6 * auVar69._24_4_);
            bVar6 = SUB81(uVar34 >> 7,0);
            local_1100._28_4_ = (uint)bVar6 * auVar59._28_4_ | (uint)!bVar6 * auVar69._28_4_;
            bVar6 = (bool)((byte)uVar26 & 1);
            local_10e0 = (float)((uint)bVar6 * auVar58._0_4_ | (uint)!bVar6 * auVar68._0_4_);
            bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
            fStack_10dc = (float)((uint)bVar6 * auVar58._4_4_ | (uint)!bVar6 * auVar68._4_4_);
            bVar6 = (bool)((byte)(uVar26 >> 2) & 1);
            fStack_10d8 = (float)((uint)bVar6 * auVar58._8_4_ | (uint)!bVar6 * auVar68._8_4_);
            bVar6 = (bool)((byte)(uVar26 >> 3) & 1);
            fStack_10d4 = (float)((uint)bVar6 * auVar58._12_4_ | (uint)!bVar6 * auVar68._12_4_);
            bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
            fStack_10d0 = (float)((uint)bVar6 * auVar58._16_4_ | (uint)!bVar6 * auVar68._16_4_);
            bVar6 = (bool)((byte)(uVar26 >> 5) & 1);
            fStack_10cc = (float)((uint)bVar6 * auVar58._20_4_ | (uint)!bVar6 * auVar68._20_4_);
            bVar6 = (bool)((byte)(uVar26 >> 6) & 1);
            fStack_10c8 = (float)((uint)bVar6 * auVar58._24_4_ | (uint)!bVar6 * auVar68._24_4_);
            bVar6 = SUB81(uVar26 >> 7,0);
            uStack_10c4 = (uint)bVar6 * auVar58._28_4_ | (uint)!bVar6 * auVar68._28_4_;
            auVar18._4_4_ = fVar100 * fStack_10dc;
            auVar18._0_4_ = fVar100 * local_10e0;
            auVar18._8_4_ = fVar100 * fStack_10d8;
            auVar18._12_4_ = fVar100 * fStack_10d4;
            auVar18._16_4_ = fVar100 * fStack_10d0;
            auVar18._20_4_ = fVar100 * fStack_10cc;
            auVar18._24_4_ = fVar100 * fStack_10c8;
            auVar18._28_4_ = fVar100;
            auVar38 = vfmadd213ps_fma(auVar98,local_1100,auVar18);
            auVar38 = vfmadd213ps_fma(auVar95,local_1120,ZEXT1632(auVar38));
            auVar62 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                         CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                                  CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                           auVar38._0_4_ + auVar38._0_4_))));
            auVar99._0_4_ = auVar61._0_4_ * local_10e0;
            auVar99._4_4_ = auVar61._4_4_ * fStack_10dc;
            auVar99._8_4_ = auVar61._8_4_ * fStack_10d8;
            auVar99._12_4_ = auVar61._12_4_ * fStack_10d4;
            auVar99._16_4_ = auVar61._16_4_ * fStack_10d0;
            auVar99._20_4_ = auVar61._20_4_ * fStack_10cc;
            auVar99._24_4_ = auVar61._24_4_ * fStack_10c8;
            auVar99._28_4_ = 0;
            auVar38 = vfmadd213ps_fma(auVar60,local_1100,auVar99);
            auVar43 = vfmadd213ps_fma(auVar80,local_1120,ZEXT1632(auVar38));
            auVar80 = vrcp14ps_avx512vl(auVar62);
            auVar58._8_4_ = 0x3f800000;
            auVar58._0_8_ = 0x3f8000003f800000;
            auVar58._12_4_ = 0x3f800000;
            auVar58._16_4_ = 0x3f800000;
            auVar58._20_4_ = 0x3f800000;
            auVar58._24_4_ = 0x3f800000;
            auVar58._28_4_ = 0x3f800000;
            auVar79 = vfnmadd213ps_avx512vl(auVar80,auVar62,auVar58);
            auVar38 = vfmadd132ps_fma(auVar79,auVar80,auVar80);
            local_1060 = ZEXT1632(CONCAT412(auVar38._12_4_ * (auVar43._12_4_ + auVar43._12_4_),
                                            CONCAT48(auVar38._8_4_ * (auVar43._8_4_ + auVar43._8_4_)
                                                     ,CONCAT44(auVar38._4_4_ *
                                                               (auVar43._4_4_ + auVar43._4_4_),
                                                               auVar38._0_4_ *
                                                               (auVar43._0_4_ + auVar43._0_4_)))));
            auVar86 = ZEXT3264(local_1060);
            uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar59._4_4_ = uVar87;
            auVar59._0_4_ = uVar87;
            auVar59._8_4_ = uVar87;
            auVar59._12_4_ = uVar87;
            auVar59._16_4_ = uVar87;
            auVar59._20_4_ = uVar87;
            auVar59._24_4_ = uVar87;
            auVar59._28_4_ = uVar87;
            uVar12 = vcmpps_avx512vl(local_1060,auVar59,0xd);
            auVar73._8_4_ = 0x80000000;
            auVar73._0_8_ = 0x8000000080000000;
            auVar73._12_4_ = 0x80000000;
            auVar73._16_4_ = 0x80000000;
            auVar73._20_4_ = 0x80000000;
            auVar73._24_4_ = 0x80000000;
            auVar73._28_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(auVar62,auVar73);
            fVar100 = (ray->super_RayK<1>).tfar;
            auVar77._4_4_ = fVar100;
            auVar77._0_4_ = fVar100;
            auVar77._8_4_ = fVar100;
            auVar77._12_4_ = fVar100;
            auVar77._16_4_ = fVar100;
            auVar77._20_4_ = fVar100;
            auVar77._24_4_ = fVar100;
            auVar77._28_4_ = fVar100;
            uVar13 = vcmpps_avx512vl(local_1060,auVar77,2);
            uVar14 = vcmpps_avx512vl(auVar62,auVar80,4);
            local_10c0 = (byte)uVar12 & (byte)uVar13 & (byte)uVar14 & local_10c0;
            uVar24 = (uint)local_10c0;
            if (local_10c0 != 0) {
              auVar80 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar104 = ZEXT3264(auVar80);
              uVar25 = vextractps_avx(auVar80._0_16_,1);
              local_1180 = auVar75;
              local_fe0 = 0xf0;
              auVar16._8_4_ = 0x219392ef;
              auVar16._0_8_ = 0x219392ef219392ef;
              auVar16._12_4_ = 0x219392ef;
              auVar16._16_4_ = 0x219392ef;
              auVar16._20_4_ = 0x219392ef;
              auVar16._24_4_ = 0x219392ef;
              auVar16._28_4_ = 0x219392ef;
              uVar37 = vcmpps_avx512vl(local_1140,auVar16,5);
              auVar79 = vrcp14ps_avx512vl(local_1140);
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = 0x3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              auVar96._16_4_ = 0x3f800000;
              auVar96._20_4_ = 0x3f800000;
              auVar96._24_4_ = 0x3f800000;
              auVar96._28_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(local_1140,auVar79,auVar96);
              auVar80 = vfmadd132ps_avx512vl(ZEXT1632(auVar38),auVar79,auVar79);
              fVar101 = (float)((uint)((byte)uVar37 & 1) * auVar80._0_4_);
              fVar100 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar80._4_4_);
              fVar102 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar80._8_4_);
              fVar1 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar80._12_4_);
              fVar2 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar80._16_4_);
              fVar3 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar80._20_4_);
              fVar83 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar80._24_4_);
              auVar19._4_4_ = fVar100 * auVar75._4_4_;
              auVar19._0_4_ = fVar101 * auVar75._0_4_;
              auVar19._8_4_ = fVar102 * auVar75._8_4_;
              auVar19._12_4_ = fVar1 * auVar75._12_4_;
              auVar19._16_4_ = fVar2 * auVar75._16_4_;
              auVar19._20_4_ = fVar3 * auVar75._20_4_;
              auVar19._24_4_ = fVar83 * auVar75._24_4_;
              auVar19._28_4_ = auVar75._28_4_;
              auVar80 = vminps_avx(auVar19,auVar96);
              auVar20._4_4_ = fVar100 * local_1160._4_4_;
              auVar20._0_4_ = fVar101 * local_1160._0_4_;
              auVar20._8_4_ = fVar102 * local_1160._8_4_;
              auVar20._12_4_ = fVar1 * local_1160._12_4_;
              auVar20._16_4_ = fVar2 * local_1160._16_4_;
              auVar20._20_4_ = fVar3 * local_1160._20_4_;
              auVar20._24_4_ = fVar83 * local_1160._24_4_;
              auVar20._28_4_ = auVar79._28_4_;
              auVar79 = vminps_avx(auVar20,auVar96);
              auVar58 = vsubps_avx(auVar96,auVar80);
              auVar59 = vsubps_avx(auVar96,auVar79);
              local_1080 = vblendps_avx(auVar79,auVar58,0xf0);
              local_10a0 = vblendps_avx(auVar80,auVar59,0xf0);
              fVar100 = (float)DAT_01fbac00;
              fVar101 = DAT_01fbac00._4_4_;
              fVar102 = DAT_01fbac00._8_4_;
              fVar83 = DAT_01fbac00._12_4_;
              fVar3 = DAT_01fbac00._16_4_;
              fVar1 = DAT_01fbac00._20_4_;
              fVar2 = DAT_01fbac00._24_4_;
              local_1040[0] = local_1120._0_4_ * fVar100;
              local_1040[1] = local_1120._4_4_ * fVar101;
              local_1040[2] = local_1120._8_4_ * fVar102;
              local_1040[3] = local_1120._12_4_ * fVar83;
              fStack_1030 = local_1120._16_4_ * fVar3;
              fStack_102c = local_1120._20_4_ * fVar1;
              fStack_1028 = local_1120._24_4_ * fVar2;
              uStack_1024 = local_1120._28_4_;
              local_1020[0] = local_1100._0_4_ * fVar100;
              local_1020[1] = local_1100._4_4_ * fVar101;
              local_1020[2] = local_1100._8_4_ * fVar102;
              local_1020[3] = local_1100._12_4_ * fVar83;
              fStack_1010 = local_1100._16_4_ * fVar3;
              fStack_100c = local_1100._20_4_ * fVar1;
              fStack_1008 = local_1100._24_4_ * fVar2;
              uStack_1004 = local_1100._28_4_;
              local_1000[0] = local_10e0 * fVar100;
              local_1000[1] = fStack_10dc * fVar101;
              local_1000[2] = fStack_10d8 * fVar102;
              local_1000[3] = fStack_10d4 * fVar83;
              fStack_ff0 = fStack_10d0 * fVar3;
              fStack_fec = fStack_10cc * fVar1;
              fStack_fe8 = fStack_10c8 * fVar2;
              uStack_fe4 = uStack_10c4;
              auVar84._8_4_ = 0x7f800000;
              auVar84._0_8_ = 0x7f8000007f800000;
              auVar84._12_4_ = 0x7f800000;
              auVar84._16_4_ = 0x7f800000;
              auVar84._20_4_ = 0x7f800000;
              auVar84._24_4_ = 0x7f800000;
              auVar84._28_4_ = 0x7f800000;
              auVar80 = vblendmps_avx512vl(auVar84,local_1060);
              auVar81._0_4_ =
                   (uint)(local_10c0 & 1) * auVar80._0_4_ |
                   (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 1 & 1);
              auVar81._4_4_ = (uint)bVar6 * auVar80._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 2 & 1);
              auVar81._8_4_ = (uint)bVar6 * auVar80._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 3 & 1);
              auVar81._12_4_ = (uint)bVar6 * auVar80._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 4 & 1);
              auVar81._16_4_ = (uint)bVar6 * auVar80._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 5 & 1);
              auVar81._20_4_ = (uint)bVar6 * auVar80._20_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(local_10c0 >> 6 & 1);
              auVar81._24_4_ = (uint)bVar6 * auVar80._24_4_ | (uint)!bVar6 * 0x7f800000;
              auVar81._28_4_ =
                   (uint)(local_10c0 >> 7) * auVar80._28_4_ |
                   (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
              auVar80 = vshufps_avx(auVar81,auVar81,0xb1);
              auVar80 = vminps_avx(auVar81,auVar80);
              auVar79 = vshufpd_avx(auVar80,auVar80,5);
              auVar80 = vminps_avx(auVar80,auVar79);
              auVar79 = vpermpd_avx2(auVar80,0x4e);
              auVar80 = vminps_avx(auVar80,auVar79);
              uVar12 = vcmpps_avx512vl(auVar81,auVar80,0);
              bVar27 = local_10c0;
              if (((byte)uVar12 & local_10c0) != 0) {
                bVar27 = (byte)uVar12 & local_10c0;
              }
              uVar28 = 0;
              for (uVar22 = (uint)bVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                uVar28 = uVar28 + 1;
              }
              local_12f0 = context->scene;
              do {
                uVar22 = uVar28 & 0xff;
                local_1298 = *(uint *)((long)&local_fc0 + (ulong)uVar22 * 4);
                local_1300 = (local_12f0->geometries).items[local_1298].ptr;
                if ((local_1300->mask & uVar25) == 0) {
                  uVar24 = (uint)(byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar24);
                }
                else {
                  pRVar5 = context->args;
                  local_11e0 = auVar104._0_32_;
                  if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                    local_12e0.context = context->user;
                    if (local_1300->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar37 = (ulong)(uVar22 << 2);
                      fVar100 = *(float *)(local_10a0 + uVar37);
                      fVar101 = *(float *)(local_1080 + uVar37);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar37);
                      (ray->Ng).field_0.field_0.x = *(float *)((long)local_1040 + uVar37);
                      (ray->Ng).field_0.field_0.y = *(float *)((long)local_1020 + uVar37);
                      (ray->Ng).field_0.field_0.z = *(float *)((long)local_1000 + uVar37);
                      ray->u = fVar100;
                      ray->v = fVar101;
                      ray->primID = *(uint *)((long)&local_11a0 + uVar37);
                      ray->geomID = local_1298;
                      ray->instID[0] = (local_12e0.context)->instID[0];
                      ray->instPrimID[0] = (local_12e0.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    local_12e0.context = context->user;
                  }
                  uVar37 = (ulong)(uVar22 * 4);
                  local_12b0 = *(float *)((long)local_1040 + uVar37);
                  local_12ac = *(undefined4 *)((long)local_1020 + uVar37);
                  local_12a8 = *(undefined4 *)((long)local_1000 + uVar37);
                  local_12a4 = *(undefined4 *)(local_10a0 + uVar37);
                  local_12a0 = *(undefined4 *)(local_1080 + uVar37);
                  local_129c = *(undefined4 *)((long)&local_11a0 + uVar37);
                  local_1294 = (local_12e0.context)->instID[0];
                  local_1290 = (local_12e0.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar37);
                  local_1314 = -1;
                  local_12e0.valid = &local_1314;
                  local_12e0.geometryUserPtr = local_1300->userPtr;
                  local_12e0.ray = (RTCRayN *)ray;
                  local_12e0.hit = (RTCHitN *)&local_12b0;
                  local_12e0.N = 1;
                  local_11c0 = auVar86._0_32_;
                  if (local_1300->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01be13f9:
                    if ((pRVar5->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_1300->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar5->filter)(&local_12e0);
                      auVar86 = ZEXT3264(local_11c0);
                      auVar112 = ZEXT1664(local_1280);
                      auVar111 = ZEXT1664(local_1270);
                      auVar110 = ZEXT1664(local_1260);
                      auVar109 = ZEXT1664(local_1250);
                      auVar108 = ZEXT1664(local_1240);
                      auVar107 = ZEXT1664(local_1230);
                      uVar30 = local_1308;
                      uVar31 = local_1310;
                      if (*local_12e0.valid == 0) goto LAB_01be14de;
                    }
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_12e0.hit;
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_12e0.hit + 4);
                    (((Vec3f *)((long)local_12e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_12e0.hit + 8);
                    *(float *)((long)local_12e0.ray + 0x3c) = *(float *)(local_12e0.hit + 0xc);
                    *(float *)((long)local_12e0.ray + 0x40) = *(float *)(local_12e0.hit + 0x10);
                    *(float *)((long)local_12e0.ray + 0x44) = *(float *)(local_12e0.hit + 0x14);
                    *(float *)((long)local_12e0.ray + 0x48) = *(float *)(local_12e0.hit + 0x18);
                    *(float *)((long)local_12e0.ray + 0x4c) = *(float *)(local_12e0.hit + 0x1c);
                    *(float *)((long)local_12e0.ray + 0x50) = *(float *)(local_12e0.hit + 0x20);
                  }
                  else {
                    (*local_1300->intersectionFilterN)(&local_12e0);
                    auVar86 = ZEXT3264(local_11c0);
                    auVar112 = ZEXT1664(local_1280);
                    auVar111 = ZEXT1664(local_1270);
                    auVar110 = ZEXT1664(local_1260);
                    auVar109 = ZEXT1664(local_1250);
                    auVar108 = ZEXT1664(local_1240);
                    auVar107 = ZEXT1664(local_1230);
                    uVar30 = local_1308;
                    uVar31 = local_1310;
                    if (*local_12e0.valid != 0) goto LAB_01be13f9;
LAB_01be14de:
                    (ray->super_RayK<1>).tfar = (float)local_11e0._0_4_;
                    uVar30 = local_1308;
                    uVar31 = local_1310;
                  }
                  fVar100 = (ray->super_RayK<1>).tfar;
                  auVar17._4_4_ = fVar100;
                  auVar17._0_4_ = fVar100;
                  auVar17._8_4_ = fVar100;
                  auVar17._12_4_ = fVar100;
                  auVar17._16_4_ = fVar100;
                  auVar17._20_4_ = fVar100;
                  auVar17._24_4_ = fVar100;
                  auVar17._28_4_ = fVar100;
                  uVar12 = vcmpps_avx512vl(auVar86._0_32_,auVar17,2);
                  uVar24 = (uint)(byte)(~(byte)(1 << (uVar28 & 0x1f)) & (byte)uVar24) & (uint)uVar12
                  ;
                  uVar25 = (ray->super_RayK<1>).mask;
                  auVar104 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                }
                bVar27 = (byte)uVar24;
                if (bVar27 == 0) break;
                auVar85._8_4_ = 0x7f800000;
                auVar85._0_8_ = 0x7f8000007f800000;
                auVar85._12_4_ = 0x7f800000;
                auVar85._16_4_ = 0x7f800000;
                auVar85._20_4_ = 0x7f800000;
                auVar85._24_4_ = 0x7f800000;
                auVar85._28_4_ = 0x7f800000;
                auVar80 = vblendmps_avx512vl(auVar85,auVar86._0_32_);
                auVar82._0_4_ =
                     (uint)(bVar27 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                auVar82._4_4_ = (uint)bVar6 * auVar80._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                auVar82._8_4_ = (uint)bVar6 * auVar80._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
                auVar82._12_4_ = (uint)bVar6 * auVar80._12_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 4) & 1);
                auVar82._16_4_ = (uint)bVar6 * auVar80._16_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 5) & 1);
                auVar82._20_4_ = (uint)bVar6 * auVar80._20_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)((byte)(uVar24 >> 6) & 1);
                auVar82._24_4_ = (uint)bVar6 * auVar80._24_4_ | (uint)!bVar6 * 0x7f800000;
                auVar82._28_4_ =
                     (uVar24 >> 7) * auVar80._28_4_ | (uint)!SUB41(uVar24 >> 7,0) * 0x7f800000;
                auVar80 = vshufps_avx(auVar82,auVar82,0xb1);
                auVar80 = vminps_avx(auVar82,auVar80);
                auVar79 = vshufpd_avx(auVar80,auVar80,5);
                auVar80 = vminps_avx(auVar80,auVar79);
                auVar79 = vpermpd_avx2(auVar80,0x4e);
                auVar80 = vminps_avx(auVar80,auVar79);
                uVar12 = vcmpps_avx512vl(auVar82,auVar80,0);
                bVar27 = (byte)uVar12 & bVar27;
                uVar22 = uVar24;
                if (bVar27 != 0) {
                  uVar22 = (uint)bVar27;
                }
                uVar28 = 0;
                for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                  uVar28 = uVar28 + 1;
                }
              } while( true );
            }
          }
          auVar104 = ZEXT1664(local_1200);
          auVar105 = ZEXT1664(local_1210);
          auVar106 = ZEXT1664(local_1220);
          fVar83 = local_11f0;
          fVar100 = fStack_11ec;
          fVar101 = fStack_11e8;
          fVar102 = fStack_11e4;
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar86 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
      }
      goto LAB_01be0a05;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }